

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * __thiscall
nlohmann::detail::
iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
::key(iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      *this)

{
  value_t vVar1;
  pointer pbVar2;
  ulong __val;
  bool bVar3;
  char cVar4;
  key_type *pkVar5;
  ulong uVar6;
  string *psVar7;
  char cVar8;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  pbVar2 = (this->anchor).m_object;
  if (pbVar2 == (pointer)0x0) {
    __assert_fail("anchor.m_object != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mrexodia[P]GitIdentityManagerCpp/json.hpp"
                  ,0x6bf,
                  "const std::string &nlohmann::detail::iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<>>>::key() const [IteratorType = nlohmann::detail::iter_impl<nlohmann::basic_json<>>]"
                 );
  }
  vVar1 = pbVar2->m_type;
  if (vVar1 == object) {
    pkVar5 = iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::key(&this->anchor);
    return pkVar5;
  }
  if (vVar1 == array) {
    __val = this->array_index;
    if (__val != this->array_index_last) {
      cVar8 = '\x01';
      if (9 < __val) {
        uVar6 = __val;
        cVar4 = '\x04';
        do {
          cVar8 = cVar4;
          if (uVar6 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_00104f72;
          }
          if (uVar6 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_00104f72;
          }
          if (uVar6 < 10000) goto LAB_00104f72;
          bVar3 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          cVar4 = cVar8 + '\x04';
        } while (bVar3);
        cVar8 = cVar8 + '\x01';
      }
LAB_00104f72:
      local_40 = local_30;
      std::__cxx11::string::_M_construct((ulong)&local_40,cVar8);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,__val);
      std::__cxx11::string::operator=((string *)&this->array_index_str,(string *)&local_40);
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
      this->array_index_last = this->array_index;
    }
    psVar7 = &this->array_index_str;
  }
  else {
    psVar7 = &this->empty_str;
  }
  return psVar7;
}

Assistant:

const std::string& key() const
    {
        assert(anchor.m_object != nullptr);

        switch (anchor.m_object->type())
        {
            // use integer array index as key
            case value_t::array:
            {
                if (array_index != array_index_last)
                {
                    array_index_str = std::to_string(array_index);
                    array_index_last = array_index;
                }
                return array_index_str;
            }

            // use key from the object
            case value_t::object:
                return anchor.key();

            // use an empty key for all primitive types
            default:
                return empty_str;
        }
    }